

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

string * __thiscall
pfederc::MatchExpr::toString_abi_cxx11_(string *__return_storage_ptr__,MatchExpr *this)

{
  Token *pTVar1;
  pointer ppTVar2;
  Token **var;
  pointer ppTVar3;
  char cVar4;
  tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  *matchcase;
  pointer ptVar5;
  bool bVar6;
  string local_58;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"match ","");
  (*((this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
     _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_58);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  cVar4 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar4);
  ptVar5 = (this->cases).
           super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->cases).
             super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar5 != local_38) {
    do {
      pTVar1 = (ptVar5->
               super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
               ).super__Head_base<0UL,_const_pfederc::Token_*,_false>._M_head_impl;
      (*pTVar1->_vptr_Token[2])(&local_58,pTVar1,(this->super_Expr).lexer);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((ptVar5->
          super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
          ).
          super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
          .
          super__Head_base<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_false>
          ._M_head_impl.
          super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (ptVar5->
          super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
          ).
          super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
          .
          super__Head_base<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_false>
          ._M_head_impl.
          super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::push_back(cVar4);
        ppTVar3 = (ptVar5->
                  super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                  ).
                  super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                  .
                  super__Head_base<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppTVar2 = (ptVar5->
                  super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                  ).
                  super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                  .
                  super__Head_base<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppTVar3 != ppTVar2) {
          bVar6 = true;
          do {
            if (bVar6) {
              bVar6 = false;
            }
            else {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            (*(*ppTVar3)->_vptr_Token[2])(&local_58,*ppTVar3,(this->super_Expr).lexer);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            ppTVar3 = ppTVar3 + 1;
          } while (ppTVar3 != ppTVar2);
        }
        std::__cxx11::string::push_back(cVar4);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      BodyExpr::toString_abi_cxx11_
                (&local_58,
                 (BodyExpr *)
                 (ptVar5->
                 super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                 ).
                 super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                 .
                 super__Tuple_impl<2UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                 .
                 super__Head_base<2UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
                 ._M_head_impl._M_t.
                 super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ptVar5 = ptVar5 + 1;
    } while (ptVar5 != local_38);
  }
  if ((this->anyCase)._M_t.
      super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl != (BodyExpr *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    BodyExpr::toString_abi_cxx11_
              (&local_58,
               (this->anyCase)._M_t.
               super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
               _M_t.
               super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
               super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::push_back(cVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string MatchExpr::toString() const noexcept {
  std::string result = "match ";
  result += getExpression().toString();
  result += '\n';
  for (auto &matchcase : cases) {
    result += std::get<0>(matchcase)->toString(getLexer());
    if (!std::get<1>(matchcase).empty()) {
      result += '(';
      bool first = true;
      for (auto &var : std::get<1>(matchcase)) {
        if (!first)
          result += ", ";
        else
          first = false;

        result += var->toString(getLexer());
      }
      result += ')';
    }

    result += " => ";

    result += std::get<2>(matchcase)->toString();
    result += ";\n";
  }

  if (anyCase) {
    result += "_ => ";
    result += anyCase->toString();
    result += ";\n";
  }

  result += ';';

  return result;
}